

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O2

int dsa_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  int iVar2;
  tuple<dsa_st_*,_bssl::internal::Deleter> dsa_00;
  BIGNUM *pBVar3;
  tuple<bignum_ctx_*,_bssl::internal::Deleter> ctx_00;
  pointer __p;
  UniquePtr<DSA> dsa;
  UniquePtr<BN_CTX> ctx;
  
  dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>)DSA_parse_parameters(params);
  dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl;
  if ((dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_dsa_st_*,_false>)0x0)
     || (params->len != 0)) {
    iVar2 = 0x57;
  }
  else {
    pBVar3 = BN_new();
    *(BIGNUM **)
     ((long)dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl + 0x20) = pBVar3;
    if (pBVar3 == (BIGNUM *)0x0) {
      iVar1 = 0;
      goto LAB_0018fa2a;
    }
    iVar1 = BN_parse_asn1_unsigned(key,(BIGNUM *)pBVar3);
    if ((iVar1 == 0) || (key->len != 0)) {
      iVar2 = 0x60;
    }
    else {
      iVar1 = dsa_check_key((DSA *)dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
      if (iVar1 != 0) {
        ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>)BN_CTX_new();
        ctx._M_t.super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl =
             (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<bignum_ctx,_bssl::internal::Deleter,_true,_true>)
             ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl;
        pBVar3 = BN_new();
        *(BIGNUM **)
         ((long)dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl + 0x18) = pBVar3;
        iVar1 = 0;
        if (pBVar3 != (BIGNUM *)0x0 &&
            ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl !=
            (_Head_base<0UL,_bignum_ctx_*,_false>)0x0) {
          iVar1 = 0;
          iVar2 = BN_mod_exp_mont_consttime
                            (pBVar3,*(BIGNUM **)
                                     ((long)dsa_00.
                                            super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl +
                                     0x10),
                             *(BIGNUM **)
                              ((long)dsa_00.
                                     super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl + 0x20),
                             *(BIGNUM **)
                              dsa_00.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,
                             (BN_CTX *)
                             ctx_00.super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                             (BN_MONT_CTX *)0x0);
          if (iVar2 != 0) {
            dsa._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>)0x0;
            EVP_PKEY_assign_DSA(out,(DSA *)dsa_00.
                                           super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl);
            iVar1 = 1;
          }
        }
        std::unique_ptr<bignum_ctx,_bssl::internal::Deleter>::~unique_ptr(&ctx);
        goto LAB_0018fa2a;
      }
      iVar2 = 0x68;
    }
  }
  iVar1 = 0;
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,iVar2);
LAB_0018fa2a:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&dsa);
  return iVar1;
}

Assistant:

static int dsa_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // See PKCS#11, v2.40, section 2.5.

  // Decode parameters.
  bssl::UniquePtr<DSA> dsa(DSA_parse_parameters(params));
  if (dsa == nullptr || CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  dsa->priv_key = BN_new();
  if (dsa->priv_key == nullptr) {
    return 0;
  }
  if (!BN_parse_asn1_unsigned(key, dsa->priv_key) || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  // To avoid DoS attacks when importing private keys, check bounds on |dsa|.
  // This bounds |dsa->priv_key| against |dsa->q| and bounds |dsa->q|'s bit
  // width.
  if (!dsa_check_key(dsa.get())) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  // Calculate the public key.
  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  dsa->pub_key = BN_new();
  if (ctx == nullptr || dsa->pub_key == nullptr ||
      !BN_mod_exp_mont_consttime(dsa->pub_key, dsa->g, dsa->priv_key, dsa->p,
                                 ctx.get(), nullptr)) {
    return 0;
  }

  EVP_PKEY_assign_DSA(out, dsa.release());
  return 1;
}